

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_render_size(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  av1_extracfg *in_RSI;
  long in_RDI;
  int *render_size;
  av1_extracfg extra_cfg;
  undefined8 *local_288;
  undefined4 in_stack_fffffffffffffd88;
  undefined1 local_268 [244];
  undefined4 local_174;
  undefined4 local_170;
  av1_extracfg *local_10;
  
  local_10 = in_RSI;
  memcpy(local_268,(void *)(in_RDI + 0x458),600);
  uVar1 = local_10->cpu_used;
  if (uVar1 < 0x29) {
    local_288 = (undefined8 *)((long)(int)uVar1 + *(long *)&local_10->sharpness);
    local_10->cpu_used = uVar1 + 8;
  }
  else {
    local_288 = *(undefined8 **)&local_10->enable_auto_bwd_ref;
    *(undefined8 **)&local_10->enable_auto_bwd_ref = local_288 + 1;
  }
  local_174 = *(undefined4 *)*local_288;
  local_170 = ((undefined4 *)*local_288)[1];
  aVar2 = update_extra_cfg((aom_codec_alg_priv_t_conflict *)
                           CONCAT44(uVar1,in_stack_fffffffffffffd88),local_10);
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_render_size(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  int *const render_size = va_arg(args, int *);
  extra_cfg.render_width = render_size[0];
  extra_cfg.render_height = render_size[1];
  return update_extra_cfg(ctx, &extra_cfg);
}